

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O2

void test_inline_array(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uVar5;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar6;
  int32_t b;
  int32_t a;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"foo","[",uVar2,0xf,1,uVar2,CONCAT44(uVar5,0xf),CONCAT44(uVar6,2),"]",0);
  uVar3 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar2,"foo","[",uVar3,0xf,&a,uVar3,0xf,&b,"]",0);
  if (cVar1 == '\0') {
    pcVar4 = "BCON_EXTRACT (bcon, \"foo\", \"[\", BCONE_INT32 (a), BCONE_INT32 (b), \"]\")";
    uVar2 = 0x154;
  }
  else if (a == 1) {
    if (b == 2) {
      bson_destroy(uVar2);
      return;
    }
    pcVar4 = "b == 2";
    uVar2 = 0x157;
  }
  else {
    pcVar4 = "a == 1";
    uVar2 = 0x156;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar2,"test_inline_array",pcVar4);
  abort();
}

Assistant:

static void
test_inline_array (void)
{
   int32_t a, b;

   bson_t *bcon = BCON_NEW ("foo", "[", BCON_INT32 (1), BCON_INT32 (2), "]");

   BSON_ASSERT (
      BCON_EXTRACT (bcon, "foo", "[", BCONE_INT32 (a), BCONE_INT32 (b), "]"));

   BSON_ASSERT (a == 1);
   BSON_ASSERT (b == 2);

   bson_destroy (bcon);
}